

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

DecodePsbtInputStruct * __thiscall
cfd::api::json::DecodePsbtInput::ConvertToStruct
          (DecodePsbtInputStruct *__return_storage_ptr__,DecodePsbtInput *this)

{
  DecodePsbtUtxoStruct local_100;
  
  DecodePsbtInputStruct::DecodePsbtInputStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  DecodeRawTransactionResponse::ConvertToStruct
            ((DecodeRawTransactionResponseStruct *)&local_100,&this->non_witness_utxo_);
  DecodeRawTransactionResponseStruct::operator=
            (&__return_storage_ptr__->non_witness_utxo,
             (DecodeRawTransactionResponseStruct *)&local_100);
  DecodeRawTransactionResponseStruct::~DecodeRawTransactionResponseStruct
            ((DecodeRawTransactionResponseStruct *)&local_100);
  DecodePsbtUtxo::ConvertToStruct(&local_100,&this->witness_utxo_);
  DecodePsbtUtxoStruct::operator=(&__return_storage_ptr__->witness_utxo,&local_100);
  DecodePsbtUtxoStruct::~DecodePsbtUtxoStruct(&local_100);
  core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
  ConvertToStruct((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)
                  &local_100,&this->partial_signatures_);
  std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::_M_move_assign
            (&__return_storage_ptr__->partial_signatures,&local_100);
  std::vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>::~vector
            ((vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *)&local_100
            );
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->sighash);
  PsbtScriptData::ConvertToStruct((PsbtScriptDataStruct *)&local_100,&this->redeem_script_);
  PsbtScriptDataStruct::operator=
            (&__return_storage_ptr__->redeem_script,(PsbtScriptDataStruct *)&local_100);
  PsbtScriptDataStruct::~PsbtScriptDataStruct((PsbtScriptDataStruct *)&local_100);
  PsbtScriptData::ConvertToStruct((PsbtScriptDataStruct *)&local_100,&this->witness_script_);
  PsbtScriptDataStruct::operator=
            (&__return_storage_ptr__->witness_script,(PsbtScriptDataStruct *)&local_100);
  PsbtScriptDataStruct::~PsbtScriptDataStruct((PsbtScriptDataStruct *)&local_100);
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)&local_100,
             &this->bip32_derivs_);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::_M_move_assign
            (&__return_storage_ptr__->bip32_derivs,&local_100);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)&local_100);
  DecodeUnlockingScript::ConvertToStruct
            ((DecodeUnlockingScriptStruct *)&local_100,&this->final_scriptsig_);
  DecodeUnlockingScriptStruct::operator=
            (&__return_storage_ptr__->final_scriptsig,(DecodeUnlockingScriptStruct *)&local_100);
  DecodeUnlockingScriptStruct::~DecodeUnlockingScriptStruct
            ((DecodeUnlockingScriptStruct *)&local_100);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_100,&this->final_scriptwitness_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&__return_storage_ptr__->final_scriptwitness,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_100);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_100,
             &this->unknown_);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::_M_move_assign
            (&__return_storage_ptr__->unknown,&local_100);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtInputStruct DecodePsbtInput::ConvertToStruct() const {  // NOLINT
  DecodePsbtInputStruct result;
  result.non_witness_utxo_hex = non_witness_utxo_hex_;
  result.non_witness_utxo = non_witness_utxo_.ConvertToStruct();
  result.witness_utxo = witness_utxo_.ConvertToStruct();
  result.partial_signatures = partial_signatures_.ConvertToStruct();
  result.sighash = sighash_;
  result.redeem_script = redeem_script_.ConvertToStruct();
  result.witness_script = witness_script_.ConvertToStruct();
  result.bip32_derivs = bip32_derivs_.ConvertToStruct();
  result.final_scriptsig = final_scriptsig_.ConvertToStruct();
  result.final_scriptwitness = final_scriptwitness_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}